

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

void printScatterDataRegressionComparison(string *name,HighsScatterData *scatter_data)

{
  if (scatter_data->num_error_comparison_ != 0) {
    printf("\n%s scatter data regression\n",(name->_M_dataplus)._M_p);
    printf("%10d regression error comparisons\n",(ulong)(uint)scatter_data->num_error_comparison_);
    printf("%10d regression awful  linear (>%10.4g)\n",0x4000000000000000,
           (ulong)(uint)scatter_data->num_awful_linear_);
    printf("%10d regression awful  log    (>%10.4g)\n",0x4000000000000000,
           (ulong)(uint)scatter_data->num_awful_log_);
    printf("%10d regression bad    linear (>%10.4g)\n",0x3fc999999999999a,
           (ulong)(uint)scatter_data->num_bad_linear_);
    printf("%10d regression bad    log    (>%10.4g)\n",0x3fc999999999999a,
           (ulong)(uint)scatter_data->num_bad_log_);
    printf("%10d regression fair   linear (>%10.4g)\n",0x3f947ae147ae147b,
           (ulong)(uint)scatter_data->num_fair_linear_);
    printf("%10d regression fair   log    (>%10.4g)\n",0x3f947ae147ae147b,
           (ulong)(uint)scatter_data->num_fair_log_);
    printf("%10d regression better linear\n",(ulong)(uint)scatter_data->num_better_linear_);
    printf("%10d regression better log\n",(ulong)(uint)scatter_data->num_better_log_);
    return;
  }
  return;
}

Assistant:

void printScatterDataRegressionComparison(
    std::string name, const HighsScatterData& scatter_data) {
  if (!scatter_data.num_error_comparison_) return;
  printf("\n%s scatter data regression\n", name.c_str());
  printf("%10" HIGHSINT_FORMAT " regression error comparisons\n",
         scatter_data.num_error_comparison_);
  printf("%10" HIGHSINT_FORMAT " regression awful  linear (>%10.4g)\n",
         scatter_data.num_awful_linear_, awful_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression awful  log    (>%10.4g)\n",
         scatter_data.num_awful_log_, awful_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression bad    linear (>%10.4g)\n",
         scatter_data.num_bad_linear_, bad_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression bad    log    (>%10.4g)\n",
         scatter_data.num_bad_log_, bad_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression fair   linear (>%10.4g)\n",
         scatter_data.num_fair_linear_, fair_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression fair   log    (>%10.4g)\n",
         scatter_data.num_fair_log_, fair_regression_error);
  printf("%10" HIGHSINT_FORMAT " regression better linear\n",
         scatter_data.num_better_linear_);
  printf("%10" HIGHSINT_FORMAT " regression better log\n",
         scatter_data.num_better_log_);
}